

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeitems.cpp
# Opt level: O3

int AF_A_RemoveForceField(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  PClass *pPVar5;
  PClass *pPVar6;
  long lVar7;
  undefined4 in_register_00000014;
  ulong uVar8;
  VMValue *pVVar9;
  long lVar10;
  char *__assertion;
  undefined8 *puVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  uVar8 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005f80b7;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar11 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar11 == (undefined8 *)0x0) {
LAB_005f7f83:
        puVar11 = (undefined8 *)0x0;
        pVVar9 = param;
      }
      else {
        auVar14._8_8_ = uVar8;
        auVar14._0_8_ = puVar11[1];
        if (puVar11[1] == 0) {
          auVar14 = (**(code **)*puVar11)(puVar11);
          puVar11[1] = auVar14._0_8_;
        }
        pPVar6 = auVar14._0_8_;
        bVar12 = pPVar6 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar12;
        uVar8 = (ulong)bVar12;
        bVar13 = pPVar6 == pPVar5;
        if (!bVar13 && !bVar12) {
          do {
            pPVar6 = pPVar6->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
            if (pPVar6 == pPVar5) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        pVVar9 = (VMValue *)(ulong)(bVar13 || bVar12);
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005f80b7;
        }
      }
      pPVar5 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005f8040;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005f80a7;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar6 = (PClass *)puVar2[1];
            if (pPVar6 == (PClass *)0x0) {
              pPVar6 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar9,uVar8,ret);
              puVar2[1] = pPVar6;
            }
            bVar12 = pPVar6 != (PClass *)0x0;
            if (pPVar6 != pPVar5 && bVar12) {
              do {
                pPVar6 = pPVar6->ParentClass;
                bVar12 = pPVar6 != (PClass *)0x0;
                if (pPVar6 == pPVar5) break;
              } while (pPVar6 != (PClass *)0x0);
            }
            if (!bVar12) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005f80b7;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005f80a7;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005f8040:
        *(byte *)((long)puVar11 + 0x18c) = *(byte *)((long)puVar11 + 0x18c) & 0xfe;
        lVar7 = (long)*(short *)(puVar11[0x22] + 0x196);
        if (0 < lVar7) {
          lVar3 = *(long *)(puVar11[0x22] + 0x198);
          lVar10 = 0;
          do {
            lVar4 = *(long *)(lVar3 + lVar10 * 8);
            if ((*(long *)(lVar4 + 0x80) != 0) && (*(int *)(lVar4 + 0x28) == 0x21)) {
              *(uint *)(lVar4 + 0x20) = *(uint *)(lVar4 + 0x20) & 0xffff7ffe;
              *(undefined4 *)(lVar4 + 0x28) = 0;
              *(undefined4 *)(*(long *)(lVar4 + 0x48) + 0x60) = 0;
              *(undefined4 *)(*(long *)(lVar4 + 0x50) + 0x60) = 0;
            }
            lVar10 = lVar10 + 1;
          } while (lVar7 != lVar10);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005f80b7;
    }
    if (puVar11 == (undefined8 *)0x0) goto LAB_005f7f83;
  }
LAB_005f80a7:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005f80b7:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeitems.cpp"
                ,0x1a,"int AF_A_RemoveForceField(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RemoveForceField)
{
	PARAM_ACTION_PROLOGUE;

	self->flags &= ~MF_SPECIAL;

	for (int i = 0; i < self->Sector->linecount; ++i)
	{
		line_t *line = self->Sector->lines[i];
		if (line->backsector != NULL && line->special == ForceField)
		{
			line->flags &= ~(ML_BLOCKING|ML_BLOCKEVERYTHING);
			line->special = 0;
			line->sidedef[0]->SetTexture(side_t::mid, FNullTextureID());
			line->sidedef[1]->SetTexture(side_t::mid, FNullTextureID());
		}
	}
	return 0;
}